

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

bool __thiscall
v_hashmap<unsigned_char_*,_Search::scored_action>::is_equivalent
          (v_hashmap<unsigned_char_*,_Search::scored_action> *this,uchar **key,uchar **key2)

{
  _func_bool_void_ptr_uchar_ptr_ptr_uchar_ptr_ptr *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  
  UNRECOVERED_JUMPTABLE = this->equivalent;
  if (UNRECOVERED_JUMPTABLE == (_func_bool_void_ptr_uchar_ptr_ptr_uchar_ptr_ptr *)0x0 &&
      this->equivalent_no_data == (_func_bool_uchar_ptr_ptr_uchar_ptr_ptr *)0x0) {
    return true;
  }
  if (UNRECOVERED_JUMPTABLE != (_func_bool_void_ptr_uchar_ptr_ptr_uchar_ptr_ptr *)0x0) {
    bVar1 = (*UNRECOVERED_JUMPTABLE)(this->eq_data,key,key2);
    return bVar1;
  }
  bVar1 = (*this->equivalent_no_data)(key,key2);
  return bVar1;
}

Assistant:

bool is_equivalent(const K& key, const K& key2)
  {
    if ((equivalent == nullptr) && (equivalent_no_data == nullptr))
      return true;
    else if (equivalent != nullptr)
      return equivalent(eq_data, key, key2);
    else
      return equivalent_no_data(key, key2);
  }